

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdlcSimulationDataGenerator::TransmitByteAsync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  pointer puVar1;
  U8 value;
  int iVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  CreateAsyncByte(this,'~');
  puVar1 = (this->mAbortFramesIndexes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->mAbortFramesIndexes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 == 0) {
    bVar7 = false;
  }
  else {
    uVar6 = 1;
    uVar5 = 0;
    do {
      bVar7 = puVar1[uVar5] == this->mFrameNumber;
      if (bVar7) break;
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < (ulong)(lVar4 >> 2));
  }
  puVar3 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      if ((bool)(uVar6 - 1 == this->mAbortByte & bVar7)) {
        CreateAsyncByte(this,'}');
        CreateAsyncByte(this,'~');
        AsyncByteFill(this,7);
        this->mAbortByte = this->mAbortByte + 1;
        return;
      }
      value = puVar3[uVar5];
      if ((byte)(value + 0x83) < 2) {
        CreateAsyncByte(this,'}');
        value = HdlcAnalyzerSettings::Bit5Inv(value);
      }
      CreateAsyncByte(this,value);
      iVar2 = rand();
      AsyncByteFill(this,iVar2 % 8);
      uVar5 = (ulong)uVar6;
      puVar3 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar5 < (ulong)((long)(stream->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
  }
  CreateAsyncByte(this,'~');
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitByteAsync( const vector<U8>& stream )
{
    // Opening flag
    CreateAsyncByte( HDLC_FLAG_VALUE );

    bool abortFrame = ContainsElement( mFrameNumber );

    for( U32 i = 0; i < stream.size(); ++i )
    {
        bool abortThisByte = ( mAbortByte == i );
        if( abortFrame && abortThisByte ) // Abort the frame: ABORT SEQUENCE = ESCAPE + FLAG
        {
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );
            CreateAsyncByte( HDLC_FLAG_VALUE );
            AsyncByteFill( 7 );
            mAbortByte++;
            return;
        }

        const U8 byte = stream[ i ];
        switch( byte )
        {
        case HDLC_FLAG_VALUE:                                                    // 0x7E
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                            // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_FLAG_VALUE ) ); // 5E
            break;
        case HDLC_ESCAPE_SEQ_VALUE:                                                    // 0x7D
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                                  // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_ESCAPE_SEQ_VALUE ) ); // 5D
            break;
        default:
            CreateAsyncByte( byte ); // normal byte
        }

        // Fill between bytes (0 to 7 bits of value 1)
        AsyncByteFill( rand() % 8 );
    }

    // Closing flag
    CreateAsyncByte( HDLC_FLAG_VALUE );
}